

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImGui::GetColorU32(ImU32 col)

{
  float fVar1;
  ImU32 a;
  float style_alpha;
  ImU32 col_local;
  uint local_4;
  
  fVar1 = (GImGui->Style).Alpha;
  local_4 = col;
  if (fVar1 < 1.0) {
    local_4 = col & 0xffffff | (int)(long)((float)(col >> 0x18) * fVar1) << 0x18;
  }
  return local_4;
}

Assistant:

ImU32 ImGui::GetColorU32(ImU32 col)
{
    float style_alpha = GImGui->Style.Alpha;
    if (style_alpha >= 1.0f)
        return col;
    ImU32 a = (col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT;
    a = (ImU32)(a * style_alpha); // We don't need to clamp 0..255 because Style.Alpha is in 0..1 range.
    return (col & ~IM_COL32_A_MASK) | (a << IM_COL32_A_SHIFT);
}